

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O0

void __thiscall
MinVR::VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode>::~VRConcreteItemFactory
          (VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode> *this)

{
  void *in_RDI;
  
  ~VRConcreteItemFactory
            ((VRConcreteItemFactory<MinVR::VRDisplayNode,_MinVR::VRConsoleNode> *)0x12f388);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

virtual ~VRConcreteItemFactory() {}